

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void spell_corpse_trap(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  OBJ_DATA *obj;
  char *pcVar5;
  CHAR_DATA *in_RDX;
  int in_EDI;
  __type_conflict2 _Var6;
  int vnum;
  int chance;
  AFFECT_DATA af;
  OBJ_DATA *trap;
  OBJ_DATA *corpse;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int from;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff82;
  undefined2 in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff86;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  CHAR_DATA *in_stack_ffffffffffffff90;
  
  from = 0xb6e;
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff70,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    pOVar4 = get_obj_here((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                          ,(char *)CONCAT44(in_stack_ffffffffffffff64,from));
    if ((pOVar4 != (OBJ_DATA *)0x0) && (bVar1 = str_cmp(target_name,""), bVar1)) {
      if ((pOVar4->item_type != 0x17) && (pOVar4->item_type != 0x18)) {
        send_to_char(in_stack_ffffffffffffff70,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        return;
      }
      if (pOVar4->level + 6 < (int)in_RDX->level) {
        send_to_char(in_stack_ffffffffffffff70,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        return;
      }
      if ((pOVar4->item_type != 0x17) && (pOVar4->contains != (OBJ_DATA *)0x0)) {
        send_to_char(in_stack_ffffffffffffff70,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        return;
      }
      iVar2 = get_skill((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_);
      iVar2 = ((int)in_RDX->level - (int)pOVar4->level) + iVar2 / 2;
      iVar3 = get_curr_stat(in_stack_ffffffffffffff90,
                            CONCAT22(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c));
      iVar3 = iVar3 + iVar2;
      iVar2 = number_percent();
      if (iVar3 < iVar2) {
        send_to_char(in_stack_ffffffffffffff70,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        act(in_stack_ffffffffffffff70,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
            (void *)CONCAT44(iVar3,from),
            (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
        extract_obj((OBJ_DATA *)
                    CONCAT26(in_stack_ffffffffffffff86,
                             CONCAT24(in_stack_ffffffffffffff84,
                                      CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))
                            ));
        return;
      }
      get_obj_index(in_stack_ffffffffffffff6c);
      obj = create_object((OBJ_INDEX_DATA *)af.next,chance);
      obj->level = in_RDX->level;
      iVar2 = number_range(from,in_stack_ffffffffffffff5c);
      obj->timer = (short)iVar2;
      if (pOVar4->item_type == 0x17) {
        obj->item_type = 0x17;
      }
      _Var6 = std::pow<int,int>(0,0x6caaf5);
      obj->extra_flags[0] = (long)_Var6 | obj->extra_flags[0];
      act(in_stack_ffffffffffffff70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (void *)CONCAT44(iVar3,from),
          (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      act(in_stack_ffffffffffffff70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
          (void *)CONCAT44(iVar3,from),
          (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0);
      extract_obj((OBJ_DATA *)
                  CONCAT26(in_stack_ffffffffffffff86,
                           CONCAT24(in_stack_ffffffffffffff84,
                                    CONCAT22(in_stack_ffffffffffffff82,in_stack_ffffffffffffff80))))
      ;
      obj_to_room(obj,in_RDX->in_room);
      pcVar5 = palloc_string((char *)CONCAT26(in_stack_ffffffffffffff8e,
                                              CONCAT24(in_stack_ffffffffffffff8c,
                                                       CONCAT22(in_stack_ffffffffffffff8a,
                                                                in_stack_ffffffffffffff88))));
      obj->owner = pcVar5;
      init_affect((AFFECT_DATA *)0x6caba6);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar3,from),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      return;
    }
    send_to_char(in_stack_ffffffffffffff70,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return;
}

Assistant:

void spell_corpse_trap(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *corpse;
	OBJ_DATA *trap;
	AFFECT_DATA af;
	int chance;
	int vnum = 2926;

	if (is_affected(ch, sn))
	{
		send_to_char("You are not ready to make another trap yet.\n\r", ch);
		return;
	}

	corpse = get_obj_here(ch, target_name);

	if (!corpse || !str_cmp(target_name, ""))
	{
		send_to_char("You don't see that here.\n\r", ch);
		return;
	}

	if (corpse->item_type != ITEM_CORPSE_NPC && corpse->item_type != ITEM_CORPSE_PC)
	{
		send_to_char("That's not a suitable corpse.\n\r", ch);
		return;
	}

	if ((corpse->level + 6) < ch->level)
	{
		send_to_char("That corpse is not powerful enough.\n\r", ch);
		return;
	}

	if (corpse->item_type != ITEM_CORPSE_NPC && corpse->contains != nullptr)
	{
		send_to_char("You can't trap a corpse with things in it!\n\r", ch);
		return;
	}

	chance = get_skill(ch, sn) / 2;
	chance += ch->level - corpse->level;
	chance += get_curr_stat(ch, STAT_INT);

	if (number_percent() > chance)
	{
		send_to_char("Your magic accelerates the decaying process too quickly, destroying the corpse.\n\r", ch);
		act("$p decays rapidly, leaving nothing but dust.", ch, corpse, 0, TO_ROOM);

		extract_obj(corpse);
		return;
	}

	trap = create_object(get_obj_index(vnum), corpse->level);
	trap->level = ch->level;
	trap->timer = number_range(5, 8);

	if (corpse->item_type == ITEM_CORPSE_NPC)
		trap->item_type = ITEM_CORPSE_NPC;

	SET_BIT(trap->extra_flags, CORPSE_NO_ANIMATE);

	act("You carefully accelerate the decay rate of $p, preparing it to explode.", ch, corpse, 0, TO_CHAR);
	act("$p's skin begins to wrinkle and fold.", ch, corpse, 0, TO_ROOM);

	extract_obj(corpse);
	obj_to_room(trap, ch->in_room);

	trap->owner = palloc_string(ch->true_name);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = sn;
	af.location = 0;
	af.modifier = 0;
	af.duration = 24;
	af.level = ch->level;
	affect_to_char(ch, &af);
}